

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint32_t extended_mpu_ap_bits(uint32_t val)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 3;
  uVar1 = 0;
  for (uVar2 = 0; uVar2 < 0x10; uVar2 = uVar2 + 2) {
    uVar1 = uVar1 | (uVar3 & val) << ((byte)uVar2 & 0x1f);
    uVar3 = uVar3 << 2;
  }
  return uVar1;
}

Assistant:

static uint32_t extended_mpu_ap_bits(uint32_t val)
{
    uint32_t ret;
    uint32_t mask;
    int i;
    ret = 0;
    mask = 3;
    for (i = 0; i < 16; i += 2) {
        ret |= (val & mask) << i;
        mask <<= 2;
    }
    return ret;
}